

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.h
# Opt level: O0

cmCommand * __thiscall cmSetTargetPropertiesCommand::Clone(cmSetTargetPropertiesCommand *this)

{
  cmCommand *this_00;
  cmSetTargetPropertiesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmSetTargetPropertiesCommand((cmSetTargetPropertiesCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmSetTargetPropertiesCommand; }